

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::incoming_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_request_alert *this)

{
  size_t sVar1;
  char msg [1024];
  string local_438;
  char local_418 [1024];
  
  peer_alert::message_abi_cxx11_(&local_438,&this->super_peer_alert);
  snprintf(local_418,0x400,"%s: incoming request [ piece: %d start: %d length: %d ]",
           local_438._M_dataplus._M_p,(ulong)*(uint *)&(this->super_peer_alert).field_0x9c,
           (ulong)*(uint *)&this->field_0xa0,*(undefined4 *)&this->field_0xa4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_418,local_418 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_request_alert::message() const
	{
		char msg[1024];
		std::snprintf(msg, sizeof(msg), "%s: incoming request [ piece: %d start: %d length: %d ]"
			, peer_alert::message().c_str(), static_cast<int>(req.piece)
			, req.start, req.length);
		return msg;
	}